

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nap_comm_struct.hpp
# Opt level: O0

void __thiscall comm_pkg::comm_pkg(comm_pkg *this)

{
  comm_data *pcVar1;
  undefined8 *in_RDI;
  
  pcVar1 = (comm_data *)operator_new(0x20);
  comm_data::comm_data(pcVar1);
  *in_RDI = pcVar1;
  pcVar1 = (comm_data *)operator_new(0x20);
  comm_data::comm_data(pcVar1);
  in_RDI[1] = pcVar1;
  return;
}

Assistant:

comm_pkg()
    {
        send_data = new comm_data();
        recv_data = new comm_data();
    }